

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GroupByState.hpp
# Opt level: O3

void __thiscall
linq::
GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
::Init(GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_&>_>,_bool,_int>
       *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  pointer piVar2;
  iterator __position;
  bool bVar3;
  undefined8 in_RAX;
  vector<int,std::allocator<int>> *this_00;
  pointer __args;
  undefined8 uStack_38;
  
  pvVar1 = (this->source).source.source;
  (this->source).source.current._M_current =
       (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  (this->source).source.end._M_current =
       (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  uStack_38 = in_RAX;
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::clear(&(this->result)._M_t);
  pvVar1 = (this->source).source.source;
  __args = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  if (__args != piVar2) {
    do {
      if ((this->transformer).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        return;
      }
      bVar3 = (*(this->transformer)._M_invoker)((_Any_data *)&this->transformer,__args);
      uStack_38 = CONCAT17(bVar3,(undefined7)uStack_38);
      this_00 = (vector<int,std::allocator<int>> *)
                std::
                map<bool,_std::vector<int,_std::allocator<int>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
                ::operator[](&this->result,(key_type_conflict *)((long)&uStack_38 + 7));
      __position._M_current = *(int **)(this_00 + 8);
      if (__position._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,__args);
      }
      else {
        *__position._M_current = *__args;
        *(int **)(this_00 + 8) = __position._M_current + 1;
      }
      __args = __args + 1;
    } while (__args != piVar2);
  }
  (this->current)._M_node = (this->result)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  return;
}

Assistant:

void Init() override 
			{
				source.Init();
				result.clear();
				
				for(const auto& x : source)
					result[transformer(x)].push_back(x);
				
				current = result.begin();
			}